

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear.cpp
# Opt level: O0

bool __thiscall LinearGE<1,_1>::propagate(LinearGE<1,_1> *this)

{
  Reason r;
  Reason r_00;
  bool bVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  int64_t iVar5;
  Lit *pLVar6;
  Lit *pLVar7;
  Clause *pCVar8;
  long in_RDI;
  uint j_5;
  uint j_4;
  Reason expl_2;
  int64_t v_2;
  uint i_3;
  uint j_3;
  uint j_2;
  Reason expl_1;
  int64_t v_1;
  uint i_2;
  uint j_1;
  uint j;
  Reason expl;
  int64_t v;
  uint i_1;
  uint i;
  int64_t max_sum;
  BoolView *in_stack_fffffffffffffeb8;
  BoolView *in_stack_fffffffffffffec0;
  undefined4 in_stack_fffffffffffffec8;
  int in_stack_fffffffffffffecc;
  anon_union_8_2_743a5d44_for_Reason_0 in_stack_fffffffffffffed0;
  undefined4 in_stack_fffffffffffffed8;
  uint in_stack_fffffffffffffedc;
  uint in_stack_fffffffffffffee0;
  undefined4 in_stack_fffffffffffffee4;
  anon_union_8_2_743a5d44_for_Reason_0 local_c8;
  int local_bc;
  uint local_b8;
  int local_b4;
  uint local_b0;
  int local_ac;
  anon_union_8_2_743a5d44_for_Reason_0 local_a8;
  long local_a0;
  uint local_94;
  anon_union_8_2_743a5d44_for_Reason_0 local_90;
  anon_union_8_2_743a5d44_for_Reason_0 local_88;
  int local_7c;
  uint local_78;
  int local_74;
  uint local_70;
  int local_6c;
  anon_union_8_2_743a5d44_for_Reason_0 local_68;
  long local_60;
  uint local_54;
  anon_union_8_2_743a5d44_for_Reason_0 local_50;
  anon_union_8_2_743a5d44_for_Reason_0 local_48;
  int local_40;
  uint local_3c;
  int local_38;
  uint local_34;
  anon_union_8_2_743a5d44_for_Reason_0 local_30;
  undefined8 local_28;
  uint local_20;
  uint local_1c;
  long local_18;
  
  bVar1 = BoolView::isFalse(in_stack_fffffffffffffec0);
  if (!bVar1) {
    local_18 = *(long *)(in_RDI + 0x70);
    for (local_1c = *(uint *)(in_RDI + 100); uVar4 = local_1c,
        uVar2 = vec<IntView<2>_>::size((vec<IntView<2>_> *)(in_RDI + 0x28)), uVar4 < uVar2;
        local_1c = local_1c + 1) {
      vec<IntView<2>_>::operator[]((vec<IntView<2>_> *)(in_RDI + 0x28),local_1c);
      iVar5 = IntView<2>::getMax((IntView<2> *)in_stack_fffffffffffffec0);
      local_18 = iVar5 + local_18;
    }
    for (local_20 = *(uint *)(in_RDI + 0x68); uVar4 = local_20,
        uVar2 = vec<IntView<3>_>::size((vec<IntView<3>_> *)(in_RDI + 0x38)), uVar4 < uVar2;
        local_20 = local_20 + 1) {
      vec<IntView<3>_>::operator[]((vec<IntView<3>_> *)(in_RDI + 0x38),local_20);
      iVar5 = IntView<3>::getMax((IntView<3> *)in_stack_fffffffffffffec0);
      local_18 = iVar5 + local_18;
    }
    if (local_18 < 0) {
      local_28 = 0;
      bVar1 = BoolView::setValNotR
                        (in_stack_fffffffffffffec0,SUB81((ulong)in_stack_fffffffffffffeb8 >> 0x38,0)
                        );
      if (bVar1) {
        Reason::Reason((Reason *)&local_30);
        if ((so.lazy & 1U) != 0) {
          for (local_34 = 0; uVar4 = local_34,
              uVar2 = vec<IntView<2>_>::size((vec<IntView<2>_> *)(in_RDI + 0x28)), uVar4 < uVar2;
              local_34 = local_34 + 1) {
            vec<IntView<2>_>::operator[]((vec<IntView<2>_> *)(in_RDI + 0x28),local_34);
            local_38 = (int)IntView<2>::getMaxLit((IntView<2> *)in_stack_fffffffffffffeb8);
            pLVar6 = vec<Lit>::operator[]((vec<Lit> *)(in_RDI + 0x78),local_34 + 1);
            pLVar6->x = local_38;
          }
          for (local_3c = 0; uVar4 = local_3c,
              uVar2 = vec<IntView<3>_>::size((vec<IntView<3>_> *)(in_RDI + 0x38)), uVar4 < uVar2;
              local_3c = local_3c + 1) {
            vec<IntView<3>_>::operator[]((vec<IntView<3>_> *)(in_RDI + 0x38),local_3c);
            local_40 = (int)IntView<3>::getMaxLit((IntView<3> *)in_stack_fffffffffffffeb8);
            iVar3 = local_3c + 1;
            uVar4 = vec<IntView<2>_>::size((vec<IntView<2>_> *)(in_RDI + 0x28));
            pLVar6 = vec<Lit>::operator[]((vec<Lit> *)(in_RDI + 0x78),iVar3 + uVar4);
            pLVar6->x = local_40;
          }
          pCVar8 = Reason_new<vec<Lit>>((vec<Lit> *)in_stack_fffffffffffffec0);
          Reason::Reason((Reason *)&local_48,pCVar8);
          local_30 = local_48;
        }
        local_50 = local_30;
        bVar1 = BoolView::setVal((BoolView *)
                                 CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8),
                                 SUB81((ulong)in_stack_fffffffffffffec0 >> 0x38,0),
                                 (Reason)in_stack_fffffffffffffed0);
        if (!bVar1) {
          return false;
        }
      }
    }
    bVar1 = BoolView::isTrue(in_stack_fffffffffffffec0);
    if (bVar1) {
      for (local_54 = *(uint *)(in_RDI + 100); uVar4 = local_54,
          uVar2 = vec<IntView<2>_>::size((vec<IntView<2>_> *)(in_RDI + 0x28)), uVar4 < uVar2;
          local_54 = local_54 + 1) {
        vec<IntView<2>_>::operator[]((vec<IntView<2>_> *)(in_RDI + 0x28),local_54);
        iVar5 = IntView<2>::getMax((IntView<2> *)in_stack_fffffffffffffec0);
        local_60 = iVar5 - local_18;
        vec<IntView<2>_>::operator[]((vec<IntView<2>_> *)(in_RDI + 0x28),local_54);
        bVar1 = IntView<2>::setMinNotR
                          ((IntView<2> *)in_stack_fffffffffffffec0,
                           (int64_t)in_stack_fffffffffffffeb8);
        if (bVar1) {
          Reason::Reason((Reason *)&local_68);
          if ((so.lazy & 1U) != 0) {
            bVar1 = BoolView::isFixed((BoolView *)0x268830);
            if (bVar1) {
              local_6c = (int)BoolView::getValLit(in_stack_fffffffffffffeb8);
              pLVar6 = vec<Lit>::operator[]((vec<Lit> *)(in_RDI + 0x78),0);
              pLVar6->x = local_6c;
            }
            for (local_70 = 0; uVar4 = local_70,
                uVar2 = vec<IntView<2>_>::size((vec<IntView<2>_> *)(in_RDI + 0x28)), uVar4 < uVar2;
                local_70 = local_70 + 1) {
              vec<IntView<2>_>::operator[]((vec<IntView<2>_> *)(in_RDI + 0x28),local_70);
              local_74 = (int)IntView<2>::getMaxLit((IntView<2> *)in_stack_fffffffffffffeb8);
              pLVar6 = vec<Lit>::operator[]((vec<Lit> *)(in_RDI + 0x78),local_70 + 1);
              pLVar6->x = local_74;
            }
            for (local_78 = 0; uVar4 = local_78,
                uVar2 = vec<IntView<3>_>::size((vec<IntView<3>_> *)(in_RDI + 0x38)), uVar4 < uVar2;
                local_78 = local_78 + 1) {
              vec<IntView<3>_>::operator[]((vec<IntView<3>_> *)(in_RDI + 0x38),local_78);
              local_7c = (int)IntView<3>::getMaxLit((IntView<3> *)in_stack_fffffffffffffeb8);
              iVar3 = local_78 + 1;
              uVar4 = vec<IntView<2>_>::size((vec<IntView<2>_> *)(in_RDI + 0x28));
              pLVar6 = vec<Lit>::operator[]((vec<Lit> *)(in_RDI + 0x78),iVar3 + uVar4);
              pLVar6->x = local_7c;
            }
            pLVar6 = vec<Lit>::operator[]((vec<Lit> *)(in_RDI + 0x78),0);
            pLVar7 = vec<Lit>::operator[]((vec<Lit> *)(in_RDI + 0x78),local_54 + 1);
            pLVar7->x = pLVar6->x;
            pCVar8 = Reason_new<vec<Lit>>((vec<Lit> *)in_stack_fffffffffffffec0);
            Reason::Reason((Reason *)&local_88,pCVar8);
            local_68 = local_88;
          }
          vec<IntView<2>_>::operator[]((vec<IntView<2>_> *)(in_RDI + 0x28),local_54);
          local_90 = local_68;
          r.field_0._a._4_4_ = in_stack_fffffffffffffee4;
          r.field_0._a._0_4_ = in_stack_fffffffffffffee0;
          bVar1 = IntView<2>::setMin((IntView<2> *)
                                     CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8),
                                     in_stack_fffffffffffffed0._a,r,
                                     SUB41((uint)in_stack_fffffffffffffecc >> 0x18,0));
          if (!bVar1) {
            return false;
          }
        }
      }
      local_94 = *(uint *)(in_RDI + 0x68);
      while (uVar4 = local_94, uVar2 = vec<IntView<3>_>::size((vec<IntView<3>_> *)(in_RDI + 0x38)),
            uVar4 < uVar2) {
        vec<IntView<3>_>::operator[]((vec<IntView<3>_> *)(in_RDI + 0x38),local_94);
        iVar5 = IntView<3>::getMax((IntView<3> *)in_stack_fffffffffffffec0);
        local_a0 = iVar5 - local_18;
        vec<IntView<3>_>::operator[]((vec<IntView<3>_> *)(in_RDI + 0x38),local_94);
        bVar1 = IntView<3>::setMinNotR
                          ((IntView<3> *)in_stack_fffffffffffffec0,
                           (int64_t)in_stack_fffffffffffffeb8);
        if (bVar1) {
          Reason::Reason((Reason *)&local_a8);
          if ((so.lazy & 1U) != 0) {
            bVar1 = BoolView::isFixed((BoolView *)0x268b21);
            if (bVar1) {
              local_ac = (int)BoolView::getValLit(in_stack_fffffffffffffeb8);
              pLVar6 = vec<Lit>::operator[]((vec<Lit> *)(in_RDI + 0x78),0);
              pLVar6->x = local_ac;
            }
            local_b0 = 0;
            while (in_stack_fffffffffffffee0 = local_b0,
                  uVar2 = vec<IntView<2>_>::size((vec<IntView<2>_> *)(in_RDI + 0x28)),
                  in_stack_fffffffffffffee0 < uVar2) {
              vec<IntView<2>_>::operator[]((vec<IntView<2>_> *)(in_RDI + 0x28),local_b0);
              local_b4 = (int)IntView<2>::getMaxLit((IntView<2> *)in_stack_fffffffffffffeb8);
              pLVar6 = vec<Lit>::operator[]((vec<Lit> *)(in_RDI + 0x78),local_b0 + 1);
              pLVar6->x = local_b4;
              local_b0 = local_b0 + 1;
            }
            local_b8 = 0;
            while (in_stack_fffffffffffffedc = local_b8,
                  uVar2 = vec<IntView<3>_>::size((vec<IntView<3>_> *)(in_RDI + 0x38)),
                  in_stack_fffffffffffffedc < uVar2) {
              vec<IntView<3>_>::operator[]((vec<IntView<3>_> *)(in_RDI + 0x38),local_b8);
              local_bc = (int)IntView<3>::getMaxLit((IntView<3> *)in_stack_fffffffffffffeb8);
              in_stack_fffffffffffffed0._pt = (Clause *)(in_RDI + 0x78);
              in_stack_fffffffffffffecc = local_b8 + 1;
              uVar2 = vec<IntView<2>_>::size((vec<IntView<2>_> *)(in_RDI + 0x28));
              pLVar6 = vec<Lit>::operator[]
                                 ((vec<Lit> *)in_stack_fffffffffffffed0._pt,
                                  in_stack_fffffffffffffecc + uVar2);
              pLVar6->x = local_bc;
              local_b8 = local_b8 + 1;
            }
            in_stack_fffffffffffffec0 =
                 (BoolView *)vec<Lit>::operator[]((vec<Lit> *)(in_RDI + 0x78),0);
            in_stack_fffffffffffffeb8 = (BoolView *)(in_RDI + 0x78);
            uVar2 = vec<IntView<2>_>::size((vec<IntView<2>_> *)(in_RDI + 0x28));
            pLVar6 = vec<Lit>::operator[]
                               ((vec<Lit> *)in_stack_fffffffffffffeb8,uVar2 + 1 + local_94);
            pLVar6->x = *(int *)&(in_stack_fffffffffffffec0->super_Var).super_Branching.
                                 _vptr_Branching;
            pCVar8 = Reason_new<vec<Lit>>((vec<Lit> *)in_stack_fffffffffffffec0);
            Reason::Reason((Reason *)&local_c8,pCVar8);
            local_a8 = local_c8;
          }
          vec<IntView<3>_>::operator[]((vec<IntView<3>_> *)(in_RDI + 0x38),local_94);
          r_00.field_0._a._4_4_ = uVar4;
          r_00.field_0._a._0_4_ = in_stack_fffffffffffffee0;
          bVar1 = IntView<3>::setMin((IntView<3> *)
                                     CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8),
                                     in_stack_fffffffffffffed0._a,r_00,
                                     SUB41((uint)in_stack_fffffffffffffecc >> 0x18,0));
          if (!bVar1) {
            return false;
          }
        }
        local_94 = local_94 + 1;
      }
    }
  }
  return true;
}

Assistant:

bool propagate() override {
		if ((R != 0) && r.isFalse()) {
			return true;
		}

		int64_t max_sum = fix_sum;

		for (unsigned int i = fix_x; i < x.size(); i++) {
			max_sum += x[i].getMax();
		}
		for (unsigned int i = fix_y; i < y.size(); i++) {
			max_sum += y[i].getMax();
		}

		//		if (R && max_sum < 0) setDom2(r, setVal, 0, x.size()+y.size());

		if ((R != 0) && max_sum < 0) {
			const int64_t v = 0;
			if (r.setValNotR(v != 0)) {
				Reason expl;
				if (so.lazy) {
					for (unsigned int j = 0; j < x.size(); j++) {
						ps[j + 1] = x[j].getMaxLit();
					}
					for (unsigned int j = 0; j < y.size(); j++) {
						ps[j + 1 + x.size()] = y[j].getMaxLit();
					}
					expl = Reason_new(ps);
				}
				if (!r.setVal(v != 0, expl)) {
					return false;
				}
			}
		}

		if ((R != 0) && !r.isTrue()) {
			return true;
		}

		//		for (int i = fix_x; i < x.size(); i++) {
		//			setDom2(x[i], setMin, x[i].getMax()-max_sum, i);
		//		}

		//		for (int i = fix_y; i < y.size(); i++) {
		//			setDom2(y[i], setMin, y[i].getMax()-max_sum, x.size()+i);
		//		}

		for (unsigned int i = fix_x; i < x.size(); i++) {
			const int64_t v = x[i].getMax() - max_sum;
			if (x[i].setMinNotR(v)) {
				Reason expl;
				if (so.lazy) {
					if ((R != 0) && r.isFixed()) {
						ps[0] = r.getValLit();
					}
					for (unsigned int j = 0; j < x.size(); j++) {
						ps[j + R] = x[j].getMaxLit();
					}
					for (unsigned int j = 0; j < y.size(); j++) {
						ps[j + R + x.size()] = y[j].getMaxLit();
					}
					ps[R + i] = ps[0];
					expl = Reason_new(ps);
				}
				if (!x[i].setMin(v, expl)) {
					return false;
				}
			}
		}

		for (unsigned int i = fix_y; i < y.size(); i++) {
			const int64_t v = y[i].getMax() - max_sum;
			if (y[i].setMinNotR(v)) {
				Reason expl;
				if (so.lazy) {
					if ((R != 0) && r.isFixed()) {
						ps[0] = r.getValLit();
					}
					for (unsigned int j = 0; j < x.size(); j++) {
						ps[j + R] = x[j].getMaxLit();
					}
					for (unsigned int j = 0; j < y.size(); j++) {
						ps[j + R + x.size()] = y[j].getMaxLit();
					}
					ps[R + x.size() + i] = ps[0];
					expl = Reason_new(ps);
				}
				if (!y[i].setMin(v, expl)) {
					return false;
				}
			}
		}

		return true;
	}